

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O2

void crnlib::dxt_fast::compress_color_block
               (dxt1_block *pDXT1_block,color_quad_u8 *pBlock,bool refine)

{
  uint uVar1;
  int i;
  uint uVar2;
  uint high16;
  uint low16;
  uint8 color_selectors [16];
  
  compress_color_block(0x10,pBlock,&low16,&high16,color_selectors,refine);
  *(undefined2 *)pDXT1_block->m_low_color = (undefined2)low16;
  *(undefined2 *)pDXT1_block->m_high_color = (undefined2)high16;
  uVar1 = 0;
  for (uVar2 = 0xf; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    uVar1 = uVar1 << 2 | (uint)color_selectors[uVar2];
  }
  *(uint *)pDXT1_block->m_selectors = uVar1;
  return;
}

Assistant:

void compress_color_block(dxt1_block* pDXT1_block, const color_quad_u8* pBlock, bool refine)
        {
            uint8 color_selectors[16];
            uint low16, high16;
            dxt_fast::compress_color_block(16, pBlock, low16, high16, color_selectors, refine);

            pDXT1_block->set_low_color(static_cast<uint16>(low16));
            pDXT1_block->set_high_color(static_cast<uint16>(high16));

            uint mask = 0;
            for (int i = 15; i >= 0; i--)
            {
                mask <<= 2;
                mask |= color_selectors[i];
            }

            pDXT1_block->m_selectors[0] = (uint8)(mask & 0xFF);
            pDXT1_block->m_selectors[1] = (uint8)((mask >> 8) & 0xFF);
            pDXT1_block->m_selectors[2] = (uint8)((mask >> 16) & 0xFF);
            pDXT1_block->m_selectors[3] = (uint8)((mask >> 24) & 0xFF);
        }